

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell.cc
# Opt level: O0

S1ChordAngle __thiscall S2Cell::GetDistance(S2Cell *this,S2Cell *target)

{
  bool bVar1;
  long lVar2;
  Vector3<double> *local_150;
  VType *local_138;
  int local_128;
  int local_124;
  int j;
  int i_1;
  VType local_118;
  VType local_110;
  S2Point local_108;
  int local_ec;
  undefined1 local_e8 [4];
  int i;
  S2Point vb [4];
  S2Point va [4];
  S2Cell *target_local;
  S2Cell *this_local;
  S1ChordAngle min_dist;
  
  if ((this->face_ == target->face_) && (bVar1 = R2Rect::Intersects(&this->uv_,&target->uv_), bVar1)
     ) {
    this_local = (S2Cell *)S1ChordAngle::Zero();
  }
  else {
    local_138 = vb[3].c_ + 2;
    do {
      Vector3<double>::Vector3((Vector3<double> *)local_138);
      local_138 = local_138 + 3;
    } while (local_138 != va[3].c_ + 2);
    local_150 = (Vector3<double> *)local_e8;
    do {
      Vector3<double>::Vector3(local_150);
      local_150 = local_150 + 1;
    } while (local_150 != (Vector3<double> *)(vb[3].c_ + 2));
    for (local_ec = 0; local_ec < 4; local_ec = local_ec + 1) {
      GetVertex(&local_108,this,local_ec);
      lVar2 = (long)local_ec;
      vb[lVar2 + 3].c_[2] = local_108.c_[0];
      va[lVar2].c_[0] = local_108.c_[1];
      va[lVar2].c_[1] = local_108.c_[2];
      GetVertex((S2Point *)&j,target,local_ec);
      lVar2 = (long)local_ec;
      *(VType *)(local_e8 + lVar2 * 0x18) = _j;
      vb[lVar2].c_[0] = local_118;
      vb[lVar2].c_[1] = local_110;
    }
    this_local = (S2Cell *)S1ChordAngle::Infinity();
    for (local_124 = 0; local_124 < 4; local_124 = local_124 + 1) {
      for (local_128 = 0; local_128 < 4; local_128 = local_128 + 1) {
        S2::UpdateMinDistance
                  ((S2Point *)(vb[(long)local_124 + 3].c_ + 2),
                   (S2Point *)(local_e8 + (long)local_128 * 0x18),
                   (S2Point *)(local_e8 + (long)(int)(local_128 + 1U & 3) * 0x18),
                   (S1ChordAngle *)&this_local);
        S2::UpdateMinDistance
                  ((S2Point *)(local_e8 + (long)local_124 * 0x18),
                   (S2Point *)(vb[(long)local_128 + 3].c_ + 2),
                   (S2Point *)(vb[(long)(int)(local_128 + 1U & 3) + 3].c_ + 2),
                   (S1ChordAngle *)&this_local);
      }
    }
  }
  return (S1ChordAngle)(double)this_local;
}

Assistant:

S1ChordAngle S2Cell::GetDistance(const S2Cell& target) const {
  // If the cells intersect, the distance is zero.  We use the (u,v) ranges
  // rather S2CellId::intersects() so that cells that share a partial edge or
  // corner are considered to intersect.
  if (face_ == target.face_ && uv_.Intersects(target.uv_)) {
    return S1ChordAngle::Zero();
  }

  // Otherwise, the minimum distance always occurs between a vertex of one
  // cell and an edge of the other cell (including the edge endpoints).  This
  // represents a total of 32 possible (vertex, edge) pairs.
  //
  // TODO(ericv): This could be optimized to be at least 5x faster by pruning
  // the set of possible closest vertex/edge pairs using the faces and (u,v)
  // ranges of both cells.
  S2Point va[4], vb[4];
  for (int i = 0; i < 4; ++i) {
    va[i] = GetVertex(i);
    vb[i] = target.GetVertex(i);
  }
  S1ChordAngle min_dist = S1ChordAngle::Infinity();
  for (int i = 0; i < 4; ++i) {
    for (int j = 0; j < 4; ++j) {
      S2::UpdateMinDistance(va[i], vb[j], vb[(j + 1) & 3], &min_dist);
      S2::UpdateMinDistance(vb[i], va[j], va[(j + 1) & 3], &min_dist);
    }
  }
  return min_dist;
}